

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes-ni.c
# Opt level: O0

void aes_ni_key_expand(uchar *key,size_t key_words,__m128i *keysched_e,__m128i *keysched_d)

{
  uint32_t uVar1;
  uint32_t uVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auStack_238 [8];
  __m128i rkey;
  size_t dround;
  size_t eround;
  size_t round;
  __m128i v_1;
  __m128i v;
  uint local_1dc;
  _Bool only_sub;
  _Bool rotate_and_round_constant;
  ulong uStack_1d8;
  uint32_t temp;
  size_t i;
  uint32_t local_1c8;
  uint rconpos;
  uint32_t sched [60];
  size_t sched_words;
  size_t rounds;
  __m128i *keysched_d_local;
  __m128i *keysched_e_local;
  size_t key_words_local;
  uchar *key_local;
  
  uVar3 = key_words + 6;
  sched._232_8_ = (key_words + 7) * 4;
  i._4_4_ = 0;
  uStack_1d8 = 0;
  do {
    if ((ulong)sched._232_8_ <= uStack_1d8) {
      for (eround = 0; eround <= uVar3; eround = eround + 1) {
        uVar2 = sched[eround * 4];
        uVar1 = sched[eround * 4 + 1];
        keysched_e[eround][0] = CONCAT44(sched[eround * 4 + -1],(&local_1c8)[eround * 4]);
        keysched_e[eround][1] = CONCAT44(uVar1,uVar2);
      }
      smemclr(&local_1c8,0xf0);
      for (dround = 0; dround <= uVar3; dround = dround + 1) {
        _auStack_238 = keysched_e[dround];
        if ((dround != 0) && (uVar3 - dround != 0)) {
          _auStack_238 = (__m128i)aesimc((undefined1  [16])keysched_e[dround]);
        }
        keysched_d[uVar3 - dround][0] = (longlong)auStack_238;
        keysched_d[uVar3 - dround][1] = rkey[0];
      }
      return;
    }
    if (uStack_1d8 < key_words) {
      uVar2 = GET_32BIT_LSB_FIRST(key + uStack_1d8 * 4);
      (&local_1c8)[uStack_1d8] = uVar2;
    }
    else {
      local_1dc = (&local_1c8)[uStack_1d8 - 1];
      if (uStack_1d8 % key_words == 0) {
        stack0xfffffffffffffe08 = ZEXT416(local_1dc) << 0x20;
        auVar4 = aeskeygenassist(stack0xfffffffffffffe08,0);
        v_1[1]._4_4_ = auVar4._4_4_;
        if (9 < i._4_4_) {
          __assert_fail("rconpos < lenof(aes_key_setup_round_constants)",
                        "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/aes-ni.c"
                        ,0x52,
                        "void aes_ni_key_expand(const unsigned char *, size_t, __m128i *, __m128i *)"
                       );
        }
        local_1dc = aes_key_setup_round_constants[i._4_4_] ^ v_1[1]._4_4_;
        i._4_4_ = i._4_4_ + 1;
      }
      else if (key_words == 8 && (uStack_1d8 & 7) == 4) {
        _round = ZEXT416(local_1dc) << 0x20;
        auVar4 = aeskeygenassist(_round,0);
        round._0_4_ = auVar4._0_4_;
        local_1dc = (uint)round;
      }
      (&local_1c8)[uStack_1d8] = (&local_1c8)[uStack_1d8 - key_words] ^ local_1dc;
    }
    uStack_1d8 = uStack_1d8 + 1;
  } while( true );
}

Assistant:

static void aes_ni_key_expand(
    const unsigned char *key, size_t key_words,
    __m128i *keysched_e, __m128i *keysched_d)
{
    size_t rounds = key_words + 6;
    size_t sched_words = (rounds + 1) * 4;

    /*
     * Store the key schedule as 32-bit integers during expansion, so
     * that it's easy to refer back to individual previous words. We
     * collect them into the final __m128i form at the end.
     */
    uint32_t sched[MAXROUNDKEYS * 4];

    unsigned rconpos = 0;

    for (size_t i = 0; i < sched_words; i++) {
        if (i < key_words) {
            sched[i] = GET_32BIT_LSB_FIRST(key + 4 * i);
        } else {
            uint32_t temp = sched[i - 1];

            bool rotate_and_round_constant = (i % key_words == 0);
            bool only_sub = (key_words == 8 && i % 8 == 4);

            if (rotate_and_round_constant) {
                __m128i v = _mm_setr_epi32(0,temp,0,0);
                v = _mm_aeskeygenassist_si128(v, 0);
                temp = _mm_extract_epi32(v, 1);

                assert(rconpos < lenof(aes_key_setup_round_constants));
                temp ^= aes_key_setup_round_constants[rconpos++];
            } else if (only_sub) {
                __m128i v = _mm_setr_epi32(0,temp,0,0);
                v = _mm_aeskeygenassist_si128(v, 0);
                temp = _mm_extract_epi32(v, 0);
            }

            sched[i] = sched[i - key_words] ^ temp;
        }
    }

    /*
     * Combine the key schedule words into __m128i vectors and store
     * them in the output context.
     */
    for (size_t round = 0; round <= rounds; round++)
        keysched_e[round] = _mm_setr_epi32(
            sched[4*round  ], sched[4*round+1],
            sched[4*round+2], sched[4*round+3]);

    smemclr(sched, sizeof(sched));

    /*
     * Now prepare the modified keys for the inverse cipher.
     */
    for (size_t eround = 0; eround <= rounds; eround++) {
        size_t dround = rounds - eround;
        __m128i rkey = keysched_e[eround];
        if (eround && dround)      /* neither first nor last */
            rkey = _mm_aesimc_si128(rkey);
        keysched_d[dround] = rkey;
    }
}